

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  ErrorCollector *pEVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  LogMessage *pLVar5;
  SourceCodeInfo *other;
  undefined8 *puVar6;
  undefined8 *puVar7;
  byte bVar8;
  Arena *arena;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  LogFinisher local_b1;
  LocationRecorder local_b0;
  LogMessage local_98;
  SourceCodeInfo local_60;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&local_60,(Arena *)0x0,false);
  this->source_code_info_ = &local_60;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&local_b0,this);
  LocationRecorder::RecordLegacyLocation(&local_b0,&file->super_Message,OTHER);
  if (this->require_syntax_identifier_ == false) {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 == 0) goto LAB_0033a9f3;
    if (this->stop_after_syntax_identifier_ == false) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
                 ,0x289);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_98,"No syntax specified for the proto file: ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,(string *)
                                 ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      pLVar5 = internal::LogMessage::operator<<(pLVar5,". Please use \'syntax = \"proto2\";\' ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"or \'syntax = \"proto3\";\' to specify a syntax ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"version. (Defaulted to proto2 syntax.)");
      internal::LogFinisher::operator=(&local_b1,pLVar5);
      internal::LogMessage::~LogMessage(&local_98);
      std::__cxx11::string::_M_replace
                ((ulong)&this->syntax_identifier_,0,
                 (char *)(this->syntax_identifier_)._M_string_length,0x3ebdd3);
    }
LAB_0033aa30:
    if (this->stop_after_syntax_identifier_ == false) {
      if ((this->input_->current_).type != TYPE_END) {
        do {
          bVar3 = ParseTopLevelStatement(this,file,&local_b0);
          if (!bVar3) {
            SkipStatement(this);
            iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar4 == 0) {
              local_98._0_8_ = (long)&local_98 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,"Unmatched \"}\".","");
              pEVar1 = this->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,&local_98);
              }
              this->had_errors_ = true;
              if (local_98._0_8_ != (long)&local_98 + 0x10U) {
                operator_delete((void *)local_98._0_8_);
              }
              io::Tokenizer::NextWithComments
                        (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
                         &this->upcoming_doc_comments_);
            }
          }
        } while ((this->input_->current_).type != TYPE_END);
      }
      LocationRecorder::~LocationRecorder(&local_b0);
      this->input_ = (Tokenizer *)0x0;
      this->source_code_info_ = (SourceCodeInfo *)0x0;
      if (file == (FileDescriptorProto *)0x0) {
        __assert_fail("file != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
                      ,0x2a4,
                      "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                     );
      }
      *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 0x10;
      other = file->source_code_info_;
      if (other == (SourceCodeInfo *)0x0) {
        uVar2 = (file->super_Message).super_MessageLite._internal_metadata_.ptr_;
        arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          arena = *(Arena **)arena;
        }
        other = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo>(arena);
        file->source_code_info_ = other;
      }
      if (other != &local_60) {
        if ((local_60.super_Message.super_MessageLite._internal_metadata_.ptr_ & 2U) == 0) {
          puVar6 = (undefined8 *)
                   (local_60.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                   0xfffffffffffffffc);
          if ((local_60.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
            puVar6 = (undefined8 *)*puVar6;
          }
        }
        else {
          puVar6 = (undefined8 *)0x0;
        }
        uVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if ((uVar2 & 2) == 0) {
          puVar7 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
        }
        else {
          puVar7 = (undefined8 *)0x0;
        }
        if (puVar6 == puVar7) {
          SourceCodeInfo::InternalSwap(&local_60,other);
        }
        else {
          internal::GenericSwap(&local_60.super_Message,&other->super_Message);
        }
      }
      bVar8 = this->had_errors_ ^ 1;
      goto LAB_0033abc3;
    }
    bVar8 = this->had_errors_ ^ 1;
  }
  else {
LAB_0033a9f3:
    bVar3 = ParseSyntaxIdentifier(this,&local_b0);
    if (bVar3) {
      if (file != (FileDescriptorProto *)0x0) {
        *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 4;
        uVar2 = (file->super_Message).super_MessageLite._internal_metadata_.ptr_;
        puVar6 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          puVar6 = (undefined8 *)*puVar6;
        }
        internal::ArenaStringPtr::Set(&file->syntax_,&this->syntax_identifier_,puVar6);
      }
      goto LAB_0033aa30;
    }
    bVar8 = 0;
  }
  LocationRecorder::~LocationRecorder(&local_b0);
LAB_0033abc3:
  SourceCodeInfo::~SourceCodeInfo(&local_60);
  return (bool)bVar8;
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier(root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != NULL) file->set_syntax(syntax_identifier_);
    } else if (!stop_after_syntax_identifier_) {
      GOOGLE_LOG(WARNING) << "No syntax specified for the proto file: " << file->name()
                   << ". Please use 'syntax = \"proto2\";' "
                   << "or 'syntax = \"proto3\";' to specify a syntax "
                   << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  assert(file != NULL);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}